

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_manager.cpp
# Opt level: O0

void __thiscall cab_manager::update_cab(cab_manager *this,id_type id,node_type from,node_type to)

{
  key_type *__k;
  anon_class_8_1_3fcf65d9_for__M_pred __pred;
  mapped_type *pmVar1;
  mapped_type *__r;
  map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
  *this_00;
  weak_ptr<cab> local_58;
  weak_ptr<cab> *local_48;
  const_iterator local_40;
  id_type *local_38;
  weak_ptr<cab> *local_30;
  __normal_iterator<std::weak_ptr<cab>_*,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>
  local_28;
  __normal_iterator<std::weak_ptr<cab>_*,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>
  local_20;
  __normal_iterator<std::weak_ptr<cab>_*,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>
  it;
  node_type to_local;
  node_type from_local;
  id_type id_local;
  cab_manager *this_local;
  
  this_00 = &this->_cabs_at_node;
  __k = (key_type *)((long)&it._M_current + 3);
  it._M_current._2_1_ = to;
  it._M_current._3_1_ = from;
  it._M_current._4_4_ = id;
  pmVar1 = std::
           map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
           ::operator[](this_00,__k);
  local_28._M_current =
       (weak_ptr<cab> *)
       std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>::begin(pmVar1);
  pmVar1 = std::
           map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
           ::operator[](this_00,__k);
  local_30 = (weak_ptr<cab> *)
             std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>::end(pmVar1);
  __pred.id = (id_type *)((long)&it._M_current + 4);
  local_38 = __pred.id;
  local_20 = std::
             find_if<__gnu_cxx::__normal_iterator<std::weak_ptr<cab>*,std::vector<std::weak_ptr<cab>,std::allocator<std::weak_ptr<cab>>>>,cab_manager::update_cab(unsigned_int,node_type,node_type)::__0>
                       (local_28,(__normal_iterator<std::weak_ptr<cab>_*,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>
                                  )local_30,__pred);
  pmVar1 = std::
           map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
           ::operator[](this_00,__k);
  __gnu_cxx::
  __normal_iterator<std::weak_ptr<cab>const*,std::vector<std::weak_ptr<cab>,std::allocator<std::weak_ptr<cab>>>>
  ::__normal_iterator<std::weak_ptr<cab>*>
            ((__normal_iterator<std::weak_ptr<cab>const*,std::vector<std::weak_ptr<cab>,std::allocator<std::weak_ptr<cab>>>>
              *)&local_40,&local_20);
  local_48 = (weak_ptr<cab> *)
             std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>::erase
                       (pmVar1,local_40);
  pmVar1 = std::
           map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
           ::operator[](this_00,(key_type *)((long)&it._M_current + 2));
  __r = std::
        unordered_map<unsigned_int,_std::shared_ptr<cab>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<cab>_>_>_>
        ::operator[](&this->_cabs,__pred.id);
  std::weak_ptr<cab>::weak_ptr<cab,void>(&local_58,__r);
  std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>::push_back(pmVar1,&local_58)
  ;
  std::weak_ptr<cab>::~weak_ptr(&local_58);
  return;
}

Assistant:

void cab_manager::update_cab(id_type id, node_type from, node_type to)
{
    auto it = std::find_if(_cabs_at_node[from].begin(), _cabs_at_node[from].end(), 
        [&id](const std::weak_ptr<cab>& cab){
            auto shared = cab.lock();
            return shared->id() == id;
    });
    _cabs_at_node[from].erase(it);
    _cabs_at_node[to].push_back(_cabs[id]);
}